

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O1

bool __thiscall S2Loop::DecodeInternal(S2Loop *this,Decoder *decoder,bool within_scope)

{
  uchar uVar1;
  uint uVar2;
  int iVar3;
  uint *puVar4;
  uchar *__src;
  undefined1 auVar5 [16];
  bool bVar6;
  S2Point *pSVar7;
  uint *puVar8;
  ulong uVar9;
  ulong uVar10;
  S2LatLngRect SStack_58;
  
  puVar8 = (uint *)decoder->buf_;
  puVar4 = (uint *)decoder->limit_;
  if (puVar4 < puVar8) {
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)&SStack_58,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/coding/coder.h"
               ,0x1a1,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)SStack_58.lat_.bounds_.c_[0],"Check failed: (limit_) >= (buf_) ",0x21);
LAB_00200216:
    abort();
  }
  if (3 < (ulong)((long)puVar4 - (long)puVar8)) {
    uVar2 = *puVar8;
    puVar8 = puVar8 + 1;
    decoder->buf_ = (uchar *)puVar8;
    if (uVar2 <= (uint)FLAGS_s2polygon_decode_max_num_vertices) {
      if (puVar4 < puVar8) {
        S2LogMessage::S2LogMessage
                  ((S2LogMessage *)&SStack_58,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/coding/coder.h"
                   ,0x1a1,kFatal,(ostream *)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)SStack_58.lat_.bounds_.c_[0],"Check failed: (limit_) >= (buf_) ",0x21)
        ;
        goto LAB_00200216;
      }
      if ((ulong)uVar2 * 0x18 + 5 <= (ulong)((long)puVar4 - (long)puVar8)) {
        (this->unindexed_contains_calls_).super___atomic_base<int>._M_i = 0;
        MutableS2ShapeIndex::Clear(&this->index_);
        if ((this->owns_vertices_ == true) && (this->vertices_ != (S2Point *)0x0)) {
          operator_delete__(this->vertices_);
        }
        this->num_vertices_ = uVar2;
        if (within_scope) {
          pSVar7 = (S2Point *)decoder->buf_;
          this->vertices_ = pSVar7;
          pSVar7 = pSVar7 + (int)uVar2;
          bVar6 = false;
        }
        else {
          uVar10 = (ulong)(int)uVar2;
          auVar5._8_8_ = 0;
          auVar5._0_8_ = uVar10;
          uVar9 = 0xffffffffffffffff;
          if (SUB168(auVar5 * ZEXT816(0x18),8) == 0) {
            uVar9 = SUB168(auVar5 * ZEXT816(0x18),0);
          }
          pSVar7 = (S2Point *)operator_new__(uVar9);
          if (uVar2 != 0) {
            memset(pSVar7,0,((uVar10 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18);
          }
          this->vertices_ = pSVar7;
          __src = decoder->buf_;
          memcpy(pSVar7,__src,uVar10 * 0x18);
          pSVar7 = (S2Point *)(__src + uVar10 * 0x18);
          bVar6 = true;
        }
        decoder->buf_ = (uchar *)pSVar7;
        this->owns_vertices_ = bVar6;
        uVar1 = *(uchar *)pSVar7->c_;
        decoder->buf_ = (uchar *)((long)pSVar7->c_ + 1);
        this->origin_inside_ = uVar1 != '\0';
        iVar3 = *(int *)((long)pSVar7->c_ + 1);
        decoder->buf_ = (uchar *)((long)pSVar7->c_ + 5);
        this->depth_ = iVar3;
        bVar6 = S2LatLngRect::Decode(&this->bound_,decoder);
        if (!bVar6) {
          return bVar6;
        }
        S2LatLngRectBounder::ExpandForSubregions(&SStack_58,&this->bound_);
        (this->subregion_bound_).lng_.bounds_.c_[0] = SStack_58.lng_.bounds_.c_[0];
        (this->subregion_bound_).lng_.bounds_.c_[1] = SStack_58.lng_.bounds_.c_[1];
        (this->subregion_bound_).lat_.bounds_.c_[0] = SStack_58.lat_.bounds_.c_[0];
        (this->subregion_bound_).lat_.bounds_.c_[1] = SStack_58.lat_.bounds_.c_[1];
        if (uVar2 == 0) {
          return bVar6;
        }
        InitIndex(this);
        return bVar6;
      }
    }
  }
  return false;
}

Assistant:

bool S2Loop::DecodeInternal(Decoder* const decoder,
                            bool within_scope) {
  // Perform all checks before modifying vertex state. Empty loops are
  // explicitly allowed here: a newly created loop has zero vertices
  // and such loops encode and decode properly.
  if (decoder->avail() < sizeof(uint32)) return false;
  const uint32 num_vertices = decoder->get32();
  if (num_vertices > FLAGS_s2polygon_decode_max_num_vertices) {
    return false;
  }
  if (decoder->avail() < (num_vertices * sizeof(*vertices_) +
                          sizeof(uint8) + sizeof(uint32))) {
    return false;
  }
  ClearIndex();
  if (owns_vertices_) delete[] vertices_;
  num_vertices_ = num_vertices;

  // x86 can do unaligned floating-point reads; however, many other
  // platforms cannot. Do not use the zero-copy version if we are on
  // an architecture that does not support unaligned reads, and the
  // pointer is not correctly aligned.
#if defined(__x86_64__) || defined(_M_X64) || defined(__i386) || \
    defined(_M_IX86)
  bool is_misaligned = false;
#else
  bool is_misaligned =
      reinterpret_cast<intptr_t>(decoder->ptr()) % sizeof(double) != 0;
#endif
  if (within_scope && !is_misaligned) {
    vertices_ = const_cast<S2Point *>(reinterpret_cast<const S2Point*>(
                    decoder->ptr()));
    decoder->skip(num_vertices_ * sizeof(*vertices_));
    owns_vertices_ = false;
  } else {
    vertices_ = new S2Point[num_vertices_];
    decoder->getn(vertices_, num_vertices_ * sizeof(*vertices_));
    owns_vertices_ = true;
  }
  origin_inside_ = decoder->get8();
  depth_ = decoder->get32();
  if (!bound_.Decode(decoder)) return false;
  subregion_bound_ = S2LatLngRectBounder::ExpandForSubregions(bound_);

  // An initialized loop will have some non-zero count of vertices. A default
  // (uninitialized) has zero vertices. This code supports encoding and
  // decoding of uninitialized loops, but we only want to call InitIndex for
  // initialized loops. Otherwise we defer InitIndex until the call to Init().
  if (num_vertices > 0) {
    InitIndex();
  }

  return true;
}